

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_hh_data.hpp
# Opt level: O2

space_type * __thiscall
pico_tree::internal::
rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
rotate_space<pico_tree::internal::space_wrapper<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>>>
          (space_type *__return_storage_ptr__,
          rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul> *this,
          rotation_type *rotation,
          space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
          space)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  scalar_type *y;
  scalar_type *x;
  float *local_40;
  float *local_38;
  
  plVar1 = *(long **)(rotation->elems_)._M_elems;
  matrix_space<float,_784UL>::matrix_space
            (__return_storage_ptr__,(plVar1[1] - *plVar1) / 0xc40,0x310);
  lVar3 = 0;
  for (uVar4 = 0; plVar1 = *(long **)(rotation->elems_)._M_elems, lVar2 = *plVar1,
      uVar4 < (ulong)((plVar1[1] - lVar2) / 0xc40); uVar4 = uVar4 + 1) {
    local_38 = (float *)(lVar2 + lVar3);
    local_40 = (float *)((long)(__return_storage_ptr__->storage_).elems.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3);
    rotate_point<float_const*,float*>((rotation_type *)this,&local_38,&local_40);
    lVar3 = lVar3 + 0xc40;
  }
  return __return_storage_ptr__;
}

Assistant:

static inline space_type rotate_space(
      rotation_type const& rotation, SpaceWrapper_ space) {
    space_type s(space.size(), space.sdim());

    for (std::size_t i = 0; i < space.size(); ++i) {
      auto x = space[i];
      auto y = s.data(i);
      rotate_point(rotation, x, y);
    }

    return s;
  }